

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDecFromTruth(word *pTruth,int nVars,int nLutSize)

{
  int iVar1;
  Vec_Int_t *vCover_00;
  Abc_Ntk_t *pNtk_00;
  char *pSop;
  Abc_Ntk_t *pNtkInit;
  Abc_Ntk_t *pNew;
  Abc_Ntk_t *pNtk;
  char *pSopCover;
  Abc_Ntk_t *pTemp;
  Vec_Int_t *vCover;
  int nLutSize_local;
  int nVars_local;
  word *pTruth_local;
  
  vCover_00 = Vec_IntAlloc(0x10000);
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pSop = Abc_SopCreateFromTruthIsop((Mem_Flex_t *)pNtk_00->pManFunc,nVars,pTruth,vCover_00);
  pNtkInit = Abc_NtkCreateWithNode(pSop);
  pTruth_local = (word *)Abc_NtkLutmin(pNtkInit,nLutSize,0);
  Abc_NtkDelete(pNtk_00);
  Abc_NtkDelete(pNtkInit);
  Vec_IntFree(vCover_00);
  iVar1 = Abc_NtkToAig((Abc_Ntk_t *)pTruth_local);
  if (iVar1 == 0) {
    Abc_NtkDelete((Abc_Ntk_t *)pTruth_local);
    fprintf(_stdout,"Converting to AIG has failed.\n");
    pTruth_local = (word *)0x0;
  }
  else {
    iVar1 = Abc_NtkHasAig((Abc_Ntk_t *)pTruth_local);
    if (iVar1 == 0) {
      __assert_fail("Abc_NtkHasAig(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkCore.c"
                    ,0x40,"Abc_Ntk_t *Abc_NtkDecFromTruth(word *, int, int)");
    }
  }
  return (Abc_Ntk_t *)pTruth_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns decomposed network.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Abc_NtkDecFromTruth( word * pTruth, int nVars, int nLutSize )
{
    extern Abc_Ntk_t * Abc_NtkLutmin( Abc_Ntk_t * pNtk, int nLutSize, int fVerbose );
    Vec_Int_t * vCover = Vec_IntAlloc( 1 << 16 );
    Abc_Ntk_t * pTemp = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    char * pSopCover = Abc_SopCreateFromTruthIsop( (Mem_Flex_t *)pTemp->pManFunc, nVars, pTruth, vCover );
    Abc_Ntk_t * pNtk = Abc_NtkCreateWithNode( pSopCover );
    Abc_Ntk_t * pNew = Abc_NtkLutmin( pNtk, nLutSize, 0 );
    Abc_NtkDelete( pTemp );
    Abc_NtkDelete( pNtk );
    Vec_IntFree( vCover );
    if ( !Abc_NtkToAig(pNew) )
    {
        Abc_NtkDelete( pNew );
        fprintf( stdout, "Converting to AIG has failed.\n" );
        return NULL;
    }
    assert( Abc_NtkHasAig(pNew) );
    return pNew;
}